

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pushdown_left_join.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ReplaceColRefWithNull
          (duckdb *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *right_bindings)

{
  ulong __code;
  pointer pEVar1;
  BoundColumnRefExpression *pBVar2;
  __node_base_ptr p_Var3;
  BoundConstantExpression *this_00;
  type expr_00;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  LogicalType local_70;
  Value local_58;
  
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expr);
  if ((pEVar1->super_BaseExpression).type == BOUND_COLUMN_REF) {
    pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(expr);
    pBVar2 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&pEVar1->super_BaseExpression);
    __code = (pBVar2->binding).table_index;
    p_Var3 = ::std::
             _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::_M_find_before_node
                       (&right_bindings->_M_h,__code % (right_bindings->_M_h)._M_bucket_count,
                        &(pBVar2->binding).table_index,__code);
    if ((p_Var3 != (__node_base_ptr)0x0) && (p_Var3->_M_nxt != (_Hash_node_base *)0x0)) {
      pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(expr);
      LogicalType::LogicalType(&local_70,&pEVar1->return_type);
      Value::Value(&local_58,&local_70);
      this_00 = (BoundConstantExpression *)operator_new(0x98);
      Value::Value((Value *)&local_b8,&local_58);
      BoundConstantExpression::BoundConstantExpression(this_00,(Value *)&local_b8);
      Value::~Value((Value *)&local_b8);
      *(BoundConstantExpression **)this = this_00;
      Value::~Value(&local_58);
      LogicalType::~LogicalType(&local_70);
      return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
    }
  }
  else {
    expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*(expr);
    local_b8._8_8_ = 0;
    pcStack_a0 = ::std::
                 _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/pushdown/pushdown_left_join.cpp:44:13)>
                 ::_M_invoke;
    local_a8 = ::std::
               _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/pushdown/pushdown_left_join.cpp:44:13)>
               ::_M_manager;
    local_b8._M_unused._M_object = right_bindings;
    ExpressionIterator::EnumerateChildren
              (expr_00,(function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&)>
                        *)&local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)(&local_b8,&local_b8,3);
    }
  }
  *(Expression **)this =
       (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

static unique_ptr<Expression> ReplaceColRefWithNull(unique_ptr<Expression> expr, unordered_set<idx_t> &right_bindings) {
	if (expr->GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
		auto &bound_colref = expr->Cast<BoundColumnRefExpression>();
		if (right_bindings.find(bound_colref.binding.table_index) != right_bindings.end()) {
			// bound colref belongs to RHS
			// replace it with a constant NULL
			return make_uniq<BoundConstantExpression>(Value(expr->return_type));
		}
		return expr;
	}
	ExpressionIterator::EnumerateChildren(
	    *expr, [&](unique_ptr<Expression> &child) { child = ReplaceColRefWithNull(std::move(child), right_bindings); });
	return expr;
}